

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O1

void stop_session_fixture(void)

{
  if (connected_session == (LIBSSH2_SESSION *)0x0) {
    stop_session_fixture_cold_1();
  }
  else {
    libssh2_session_disconnect_ex(connected_session,0xb,"test ended","");
    libssh2_session_free(connected_session);
    connected_session = (LIBSSH2_SESSION *)0x0;
  }
  close_socket_to_openssh_server(connected_socket);
  connected_socket = -1;
  libssh2_exit();
  stop_openssh_fixture();
  return;
}

Assistant:

void stop_session_fixture(void)
{
    if(connected_session) {
        libssh2_session_disconnect(connected_session, "test ended");
        libssh2_session_free(connected_session);
        connected_session = NULL;
    }
    else {
        fprintf(stderr, "Cannot stop session - none started\n");
    }

    close_socket_to_openssh_server(connected_socket);
    connected_socket = LIBSSH2_INVALID_SOCKET;

    libssh2_exit();

    stop_openssh_fixture();
}